

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O2

Shape * trieste::wf::ops::operator<<=(Shape *__return_storage_ptr__,Token *type,Field *field)

{
  initializer_list<trieste::wf::Field> __l;
  allocator_type local_59;
  Fields local_58;
  Field local_38;
  
  Field::Field(&local_38,field);
  __l._M_len = 1;
  __l._M_array = &local_38;
  CLI::std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::vector
            (&local_58.fields,__l,&local_59);
  local_58.binding.def = (TokenDef *)Invalid;
  operator<<=(__return_storage_ptr__,type,&local_58);
  CLI::std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::~vector
            (&local_58.fields);
  CLI::std::_Vector_base<trieste::Token,_std::allocator<trieste::Token>_>::~_Vector_base
            ((_Vector_base<trieste::Token,_std::allocator<trieste::Token>_> *)&local_38.choice);
  return __return_storage_ptr__;
}

Assistant:

inline Shape operator<<=(const Token& type, Field&& field)
      {
        return type <<= Fields{std::vector<Field>{field}, Invalid};
      }